

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depth_first_traverser.h
# Opt level: O3

bool __thiscall
draco::
DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
::TraverseFromCorner
          (DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
           *this,CornerIndex corner_id)

{
  vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  *this_00;
  pointer *ppIVar1;
  ulong *puVar2;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *pIVar3;
  ulong uVar4;
  int iVar5;
  iterator iVar6;
  _Bit_type *p_Var7;
  pointer pIVar8;
  CornerTable *pCVar9;
  uint uVar10;
  pointer pIVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  MeshAttributeIndicesEncodingData *pMVar16;
  uint uVar17;
  bool bVar18;
  CornerIndex right_corner_id;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_40;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_3c;
  vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
  *local_38;
  
  if ((corner_id.value_ != 0xffffffff) &&
     ((*(ulong *)((long)(this->
                        super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                        ).is_face_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                 (ulong)(corner_id.value_ / 0x18 & 0xfffffff8)) >>
       ((ulong)corner_id.value_ / 3 & 0x3f) & 1) == 0)) {
    pIVar3 = (this->corner_traversal_stack_).
             super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar6._M_current =
         (this->corner_traversal_stack_).
         super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar6._M_current != pIVar3) {
      (this->corner_traversal_stack_).
      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pIVar3;
      iVar6._M_current = pIVar3;
    }
    this_00 = &this->corner_traversal_stack_;
    local_40.value_ = corner_id.value_;
    if (iVar6._M_current ==
        (this->corner_traversal_stack_).
        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
      ::_M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
                ((vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                  *)this_00,iVar6,&local_40);
    }
    else {
      (iVar6._M_current)->value_ = corner_id.value_;
      (this->corner_traversal_stack_).
      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = iVar6._M_current + 1;
    }
    pCVar9 = (this->
             super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
             ).corner_table_;
    if (local_40.value_ == 0xffffffff) {
      pIVar11 = (pCVar9->corner_to_vertex_map_).
                super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar13 = (ulong)pIVar11[0xffffffff].value_;
      uVar10 = 0xffffffff;
    }
    else {
      uVar10 = local_40.value_ - 2;
      if (0x55555555 < local_40.value_ * -0x55555555 + 0xaaaaaaab) {
        uVar10 = local_40.value_ + 1;
      }
      pIVar11 = (pCVar9->corner_to_vertex_map_).
                super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar13 = (ulong)pIVar11[uVar10].value_;
      if (local_40.value_ * -0x55555555 < 0x55555556) {
        uVar10 = local_40.value_ + 2;
      }
      else {
        uVar10 = local_40.value_ - 1;
      }
    }
    if ((int)uVar13 == -1) {
      return false;
    }
    uVar10 = pIVar11[uVar10].value_;
    if (uVar10 == 0xffffffff) {
      return false;
    }
    p_Var7 = (this->
             super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
             ).is_vertex_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    local_38 = (vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                *)this_00;
    if ((p_Var7[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) == 0) {
      p_Var7[uVar13 >> 6] = p_Var7[uVar13 >> 6] | 1L << ((byte)uVar13 & 0x3f);
      if (local_40.value_ == 0xffffffff) {
        uVar15 = 0xffffffff;
      }
      else {
        uVar15 = local_40.value_ - 2;
        if (0x55555555 < (local_40.value_ + 1) * -0x55555555) {
          uVar15 = local_40.value_ + 1;
        }
      }
      local_3c.value_ = uVar15;
      PointsSequencer::AddPointId
                ((this->
                 super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                 ).traversal_observer_.sequencer_,
                 (PointIndex)
                 (((this->
                   super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                   ).traversal_observer_.mesh_)->faces_).vector_.
                 super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[(ulong)uVar15 / 3]._M_elems[uVar15 % 3].
                 value_);
      pMVar16 = (this->
                super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                ).traversal_observer_.encoding_data_;
      iVar6._M_current =
           (pMVar16->encoded_attribute_value_index_to_corner_map).
           super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (pMVar16->encoded_attribute_value_index_to_corner_map).
          super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
        ::_M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
                  ((vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                    *)pMVar16,iVar6,&local_3c);
        pMVar16 = (this->
                  super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                  ).traversal_observer_.encoding_data_;
      }
      else {
        (iVar6._M_current)->value_ = uVar15;
        (pMVar16->encoded_attribute_value_index_to_corner_map).
        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = iVar6._M_current + 1;
      }
      iVar5 = pMVar16->num_values;
      (pMVar16->vertex_to_encoded_attribute_value_index_map).
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[uVar13]
           = iVar5;
      pMVar16->num_values = iVar5 + 1;
      p_Var7 = (this->
               super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
               ).is_vertex_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    }
    if ((p_Var7[uVar10 >> 6] >> ((ulong)uVar10 & 0x3f) & 1) == 0) {
      p_Var7[uVar10 >> 6] = p_Var7[uVar10 >> 6] | 1L << ((byte)uVar10 & 0x3f);
      if (local_40.value_ == 0xffffffff) {
        uVar15 = 0xffffffff;
      }
      else if (local_40.value_ * -0x55555555 < 0x55555556) {
        uVar15 = local_40.value_ + 2;
      }
      else {
        uVar15 = local_40.value_ - 1;
      }
      local_3c.value_ = uVar15;
      PointsSequencer::AddPointId
                ((this->
                 super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                 ).traversal_observer_.sequencer_,
                 (PointIndex)
                 (((this->
                   super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                   ).traversal_observer_.mesh_)->faces_).vector_.
                 super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[(ulong)uVar15 / 3]._M_elems[uVar15 % 3].
                 value_);
      pMVar16 = (this->
                super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                ).traversal_observer_.encoding_data_;
      iVar6._M_current =
           (pMVar16->encoded_attribute_value_index_to_corner_map).
           super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (pMVar16->encoded_attribute_value_index_to_corner_map).
          super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
        ::_M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
                  ((vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                    *)pMVar16,iVar6,&local_3c);
        pMVar16 = (this->
                  super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                  ).traversal_observer_.encoding_data_;
      }
      else {
        (iVar6._M_current)->value_ = uVar15;
        (pMVar16->encoded_attribute_value_index_to_corner_map).
        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = iVar6._M_current + 1;
      }
      iVar5 = pMVar16->num_values;
      (pMVar16->vertex_to_encoded_attribute_value_index_map).
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[uVar10]
           = iVar5;
      pMVar16->num_values = iVar5 + 1;
    }
    pIVar8 = (this->corner_traversal_stack_).
             super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((this->corner_traversal_stack_).
        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != pIVar8) {
LAB_00134e72:
      local_40.value_ = pIVar8[-1].value_;
      uVar13 = (ulong)local_40.value_;
      if (uVar13 != 0xffffffff) {
        uVar12 = (ulong)local_40.value_ / 3;
        p_Var7 = (this->
                 super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                 ).is_face_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
        uVar14 = (ulong)local_40.value_ / 0xc0;
        uVar4 = p_Var7[uVar14];
        if ((uVar4 >> (uVar12 & 0x3f) & 1) == 0) {
          p_Var7[uVar14] = 1L << ((byte)uVar12 & 0x3f) | uVar4;
          pCVar9 = (this->
                   super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                   ).corner_table_;
          do {
            uVar10 = (pCVar9->corner_to_vertex_map_).
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar13].value_;
            if (uVar10 == 0xffffffff) {
              return false;
            }
            p_Var7 = (this->
                     super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                     ).is_vertex_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
            uVar4 = p_Var7[uVar10 >> 6];
            if ((uVar4 >> ((ulong)uVar10 & 0x3f) & 1) == 0) {
              uVar15 = (pCVar9->vertex_to_left_most_corner_map_).
                       super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar10].value_;
              bVar18 = true;
              if (uVar15 != 0xffffffff) {
                uVar17 = uVar15 + 1;
                if (uVar17 * -0x55555555 < 0x55555556) {
                  uVar17 = uVar15 - 2;
                }
                if (((uVar17 != 0xffffffff) &&
                    ((*(ulong *)((long)(pCVar9->is_edge_on_seam_).
                                       super__Bvector_base<std::allocator<bool>_>._M_impl.
                                       super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                       _M_p + (ulong)(uVar17 >> 6) * 8) >> ((ulong)uVar17 & 0x3f) &
                     1) == 0)) &&
                   (uVar15 = (pCVar9->corner_table_->opposite_corners_).vector_.
                             super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar17].value_,
                   uVar15 != 0xffffffff)) {
                  iVar5 = uVar15 + 1;
                  if ((uint)(iVar5 * -0x55555555) < 0x55555556) {
                    iVar5 = uVar15 - 2;
                  }
                  bVar18 = iVar5 == -1;
                }
              }
              p_Var7[uVar10 >> 6] = uVar4 | 1L << ((byte)uVar10 & 0x3f);
              uVar15 = (uint)uVar13;
              local_3c.value_ = uVar15;
              PointsSequencer::AddPointId
                        ((this->
                         super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                         ).traversal_observer_.sequencer_,
                         (PointIndex)
                         (((this->
                           super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                           ).traversal_observer_.mesh_)->faces_).vector_.
                         super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar13 / 3]._M_elems
                         [uVar15 + (int)(uVar13 / 3) * -3].value_);
              pMVar16 = (this->
                        super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                        ).traversal_observer_.encoding_data_;
              iVar6._M_current =
                   (pMVar16->encoded_attribute_value_index_to_corner_map).
                   super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              if (iVar6._M_current ==
                  (pMVar16->encoded_attribute_value_index_to_corner_map).
                  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                ::
                _M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
                          ((vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                            *)pMVar16,iVar6,&local_3c);
                pMVar16 = (this->
                          super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                          ).traversal_observer_.encoding_data_;
              }
              else {
                (iVar6._M_current)->value_ = uVar15;
                (pMVar16->encoded_attribute_value_index_to_corner_map).
                super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = iVar6._M_current + 1;
              }
              iVar5 = pMVar16->num_values;
              (pMVar16->vertex_to_encoded_attribute_value_index_map).
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              [uVar10] = iVar5;
              pMVar16->num_values = iVar5 + 1;
              pCVar9 = (this->
                       super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                       ).corner_table_;
              uVar13 = (ulong)local_40.value_;
              if (bVar18) goto LAB_00134fff;
              local_3c.value_ = 0xffffffff;
              if (local_40.value_ != 0xffffffff) {
                uVar10 = local_40.value_ + 1;
                if (uVar10 * -0x55555555 < 0x55555556) {
                  uVar10 = local_40.value_ - 2;
                }
                if ((uVar10 != 0xffffffff) &&
                   ((*(ulong *)((long)(pCVar9->is_edge_on_seam_).
                                      super__Bvector_base<std::allocator<bool>_>._M_impl.
                                      super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                      _M_p + (ulong)(uVar10 >> 6) * 8) >> ((ulong)uVar10 & 0x3f) & 1
                    ) == 0)) {
                  local_3c.value_ =
                       (pCVar9->corner_table_->opposite_corners_).vector_.
                       super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar10].value_;
                }
              }
              uVar10 = local_3c.value_ / 3;
            }
            else {
LAB_00134fff:
              iVar5 = (int)uVar13;
              if (iVar5 == -1) goto LAB_0013517b;
              uVar10 = iVar5 + 1;
              if (uVar10 * -0x55555555 < 0x55555556) {
                uVar10 = iVar5 - 2;
              }
              local_3c.value_ = 0xffffffff;
              if ((uVar10 != 0xffffffff) &&
                 ((*(ulong *)((long)(pCVar9->is_edge_on_seam_).
                                    super__Bvector_base<std::allocator<bool>_>._M_impl.
                                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                             + (ulong)(uVar10 >> 6) * 8) >> ((ulong)uVar10 & 0x3f) & 1) == 0)) {
                local_3c.value_ =
                     (pCVar9->corner_table_->opposite_corners_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar10].value_;
              }
              if ((uint)(iVar5 * -0x55555555) < 0x55555556) {
                uVar10 = iVar5 + 2;
                if (uVar10 != 0xffffffff) goto LAB_0013506a;
                uVar15 = 0xffffffff;
              }
              else {
                uVar10 = iVar5 - 1;
LAB_0013506a:
                uVar15 = 0xffffffff;
                if ((*(ulong *)((long)(pCVar9->is_edge_on_seam_).
                                      super__Bvector_base<std::allocator<bool>_>._M_impl.
                                      super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                      _M_p + (ulong)(uVar10 >> 6) * 8) >> ((ulong)uVar10 & 0x3f) & 1
                    ) == 0) {
                  uVar15 = (pCVar9->corner_table_->opposite_corners_).vector_.
                           super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar10].value_;
                }
              }
              uVar13 = (ulong)uVar15;
              if (local_3c.value_ != 0xffffffff) {
                p_Var7 = (this->
                         super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                         ).is_face_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
                uVar10 = local_3c.value_ / 3;
                if ((p_Var7[local_3c.value_ / 0xc0] >> ((ulong)local_3c.value_ / 3 & 0x3f) & 1) == 0
                   ) {
                  if ((uVar15 == 0xffffffff) ||
                     (uVar10 = local_3c.value_ / 3,
                     (p_Var7[uVar13 / 0xc0] >> (uVar13 / 3 & 0x3f) & 1) != 0)) goto LAB_0013513b;
                  iVar6._M_current =
                       (this->corner_traversal_stack_).
                       super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  iVar6._M_current[-1].value_ = uVar15;
                  if (iVar6._M_current ==
                      (this->corner_traversal_stack_).
                      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::
                    vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                    ::
                    _M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
                              (local_38,iVar6,&local_3c);
                  }
                  else {
                    (iVar6._M_current)->value_ = local_3c.value_;
                    (this->corner_traversal_stack_).
                    super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = iVar6._M_current + 1;
                  }
                  goto LAB_00134eb0;
                }
              }
              if ((uVar15 == 0xffffffff) ||
                 (uVar10 = uVar15 / 3, local_3c.value_ = uVar15,
                 ((this->
                  super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                  ).is_face_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar13 / 0xc0] >>
                  (uVar13 / 3 & 0x3f) & 1) != 0)) goto LAB_0013517b;
            }
LAB_0013513b:
            local_40.value_ = local_3c.value_;
            puVar2 = (this->
                     super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                     ).is_face_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + (uVar10 >> 6)
            ;
            *puVar2 = *puVar2 | 1L << ((byte)uVar10 & 0x3f);
            pCVar9 = (this->
                     super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                     ).corner_table_;
            uVar13 = (ulong)local_40.value_;
          } while( true );
        }
      }
      (this->corner_traversal_stack_).
      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pIVar8 + -1;
      goto LAB_00134eb0;
    }
  }
  return true;
LAB_0013517b:
  ppIVar1 = &(this->corner_traversal_stack_).
             super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  *ppIVar1 = *ppIVar1 + -1;
LAB_00134eb0:
  pIVar8 = (this->corner_traversal_stack_).
           super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->corner_traversal_stack_).
      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_start == pIVar8) {
    return true;
  }
  goto LAB_00134e72;
}

Assistant:

bool TraverseFromCorner(CornerIndex corner_id) {
    if (this->IsFaceVisited(corner_id)) {
      return true;  // Already traversed.
    }

    corner_traversal_stack_.clear();
    corner_traversal_stack_.push_back(corner_id);
    // For the first face, check the remaining corners as they may not be
    // processed yet.
    const VertexIndex next_vert =
        this->corner_table()->Vertex(this->corner_table()->Next(corner_id));
    const VertexIndex prev_vert =
        this->corner_table()->Vertex(this->corner_table()->Previous(corner_id));
    if (next_vert == kInvalidVertexIndex || prev_vert == kInvalidVertexIndex) {
      return false;
    }
    if (!this->IsVertexVisited(next_vert)) {
      this->MarkVertexVisited(next_vert);
      this->traversal_observer().OnNewVertexVisited(
          next_vert, this->corner_table()->Next(corner_id));
    }
    if (!this->IsVertexVisited(prev_vert)) {
      this->MarkVertexVisited(prev_vert);
      this->traversal_observer().OnNewVertexVisited(
          prev_vert, this->corner_table()->Previous(corner_id));
    }

    // Start the actual traversal.
    while (!corner_traversal_stack_.empty()) {
      // Currently processed corner.
      corner_id = corner_traversal_stack_.back();
      FaceIndex face_id(corner_id.value() / 3);
      // Make sure the face hasn't been visited yet.
      if (corner_id == kInvalidCornerIndex || this->IsFaceVisited(face_id)) {
        // This face has been already traversed.
        corner_traversal_stack_.pop_back();
        continue;
      }
      while (true) {
        this->MarkFaceVisited(face_id);
        this->traversal_observer().OnNewFaceVisited(face_id);
        const VertexIndex vert_id = this->corner_table()->Vertex(corner_id);
        if (vert_id == kInvalidVertexIndex) {
          return false;
        }
        if (!this->IsVertexVisited(vert_id)) {
          const bool on_boundary = this->corner_table()->IsOnBoundary(vert_id);
          this->MarkVertexVisited(vert_id);
          this->traversal_observer().OnNewVertexVisited(vert_id, corner_id);
          if (!on_boundary) {
            corner_id = this->corner_table()->GetRightCorner(corner_id);
            face_id = FaceIndex(corner_id.value() / 3);
            continue;
          }
        }
        // The current vertex has been already visited or it was on a boundary.
        // We need to determine whether we can visit any of it's neighboring
        // faces.
        const CornerIndex right_corner_id =
            this->corner_table()->GetRightCorner(corner_id);
        const CornerIndex left_corner_id =
            this->corner_table()->GetLeftCorner(corner_id);
        const FaceIndex right_face_id(
            (right_corner_id == kInvalidCornerIndex
                 ? kInvalidFaceIndex
                 : FaceIndex(right_corner_id.value() / 3)));
        const FaceIndex left_face_id(
            (left_corner_id == kInvalidCornerIndex
                 ? kInvalidFaceIndex
                 : FaceIndex(left_corner_id.value() / 3)));
        if (this->IsFaceVisited(right_face_id)) {
          // Right face has been already visited.
          if (this->IsFaceVisited(left_face_id)) {
            // Both neighboring faces are visited. End reached.
            corner_traversal_stack_.pop_back();
            break;  // Break from the while (true) loop.
          } else {
            // Go to the left face.
            corner_id = left_corner_id;
            face_id = left_face_id;
          }
        } else {
          // Right face was not visited.
          if (this->IsFaceVisited(left_face_id)) {
            // Left face visited, go to the right one.
            corner_id = right_corner_id;
            face_id = right_face_id;
          } else {
            // Both neighboring faces are unvisited, we need to visit both of
            // them.

            // Split the traversal.
            // First make the top of the current corner stack point to the left
            // face (this one will be processed second).
            corner_traversal_stack_.back() = left_corner_id;
            // Add a new corner to the top of the stack (right face needs to
            // be traversed first).
            corner_traversal_stack_.push_back(right_corner_id);
            // Break from the while (true) loop.
            break;
          }
        }
      }
    }
    return true;
  }